

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenFile(InMemoryDirectory *this,PathPtr path)

{
  size_t sVar1;
  Impl *pIVar2;
  String *pSVar3;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *pOVar4;
  ReadableDirectory *pRVar5;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar6;
  StringPtr name;
  StringPtr name_00;
  PathPtr PVar7;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar8;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *subdir;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> _subdir1090;
  EntryImpl *entry;
  undefined1 local_70 [16];
  EntryImpl *_entry1084;
  undefined1 local_58 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_30;
  Fault f;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  this_local = (InMemoryDirectory *)path.parts.size_;
  name_00.content.ptr = (Exception *)path.parts.ptr;
  f.exception = name_00.content.ptr;
  path_local.parts.size_ = (size_t)this;
  sVar1 = PathPtr::size((PathPtr *)&this_local);
  if (sVar1 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x439,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)this);
    kj::_::Debug::Fault::~Fault(&local_30);
    pRVar6 = extraout_RDX;
  }
  else {
    sVar1 = PathPtr::size((PathPtr *)&this_local);
    if (sVar1 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_58,
                 &(name_00.content.ptr)->file);
      pIVar2 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                          local_58);
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&entry,pSVar3);
      name.content.size_ = (size_t)entry;
      name.content.ptr = (char *)pIVar2;
      Impl::tryGetEntry((Impl *)local_70,name);
      local_70._8_8_ =
           kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_const>
                     ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                      local_70);
      if ((EntryImpl *)local_70._8_8_ == (EntryImpl *)0x0) {
        Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)this);
      }
      else {
        asFile(this,(Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                    name_00.content.ptr,(EntryImpl *)local_58);
      }
      _subdir1090.value.ptr._4_4_ = 1;
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_58);
      pRVar6 = extraout_RDX_00;
    }
    else {
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&subdir,pSVar3);
      name_00.content.size_ = (size_t)subdir;
      tryGetParent((InMemoryDirectory *)local_b0,name_00);
      kj::_::readMaybe<kj::ReadableDirectory_const,decltype(nullptr)>
                ((_ *)local_a0,
                 (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_b0);
      Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_b0);
      pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_a0);
      if (pOVar4 == (Own<const_kj::ReadableDirectory,_std::nullptr_t> *)0x0) {
        Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)this);
      }
      else {
        pOVar4 = kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::operator*
                           ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_a0);
        pRVar5 = Own<const_kj::ReadableDirectory,_std::nullptr_t>::operator->(pOVar4);
        sVar1 = PathPtr::size((PathPtr *)&this_local);
        PVar7 = PathPtr::slice((PathPtr *)&this_local,1,sVar1);
        (*(pRVar5->super_FsNode)._vptr_FsNode[10])(this,pRVar5,PVar7.parts.ptr,PVar7.parts.size_);
      }
      _subdir1090.value.ptr._4_4_ = 1;
      kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_a0);
      pRVar6 = extraout_RDX_01;
    }
  }
  MVar8.ptr.ptr = pRVar6;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar8.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a file") { return kj::none; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asFile(lock, entry);
      } else {
        return kj::none;
      }
    }